

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lp_solver.cc
# Opt level: O2

void __thiscall ipx::LpSolver::RunIPM(LpSolver *this)

{
  IPM ipm;
  allocator local_89;
  string local_88;
  IPM local_68;
  
  IPM::IPM(&local_68,&this->control_);
  (this->info_).super_ipx_info.centring_tried = 0;
  (this->info_).super_ipx_info.centring_success = 0;
  if ((this->x_start_)._M_size == 0) {
    ComputeStartingPoint(this,&local_68);
    if ((this->info_).super_ipx_info.status_ipm != 0) {
      return;
    }
    RunInitialIPM(this,&local_68);
    if ((this->info_).super_ipx_info.status_ipm != 0) {
      return;
    }
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_88,
               " Using starting point provided by user. Skipping initial iterations.\n",&local_89);
    Control::hLog(&this->control_,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    Iterate::Initialize((this->iterate_)._M_t.
                        super___uniq_ptr_impl<ipx::Iterate,_std::default_delete<ipx::Iterate>_>._M_t
                        .super__Tuple_impl<0UL,_ipx::Iterate_*,_std::default_delete<ipx::Iterate>_>.
                        super__Head_base<0UL,_ipx::Iterate_*,_false>._M_head_impl,&this->x_start_,
                        &this->xl_start_,&this->xu_start_,&this->y_start_,&this->zl_start_,
                        &this->zu_start_);
  }
  BuildStartingBasis(this);
  if ((this->info_).super_ipx_info.centring_tried == 0 &&
      (this->info_).super_ipx_info.status_ipm == 0) {
    RunMainIPM(this,&local_68);
  }
  return;
}

Assistant:

void LpSolver::RunIPM() {
    IPM ipm(control_);
    info_.centring_tried = false;
    info_.centring_success = false;

    if (x_start_.size() != 0) {
      control_.hLog(" Using starting point provided by user. Skipping initial iterations.\n");
        iterate_->Initialize(x_start_, xl_start_, xu_start_,
                             y_start_, zl_start_, zu_start_);
    }
    else {
        ComputeStartingPoint(ipm);
        if (info_.status_ipm != IPX_STATUS_not_run)
            return;
        RunInitialIPM(ipm);
        if (info_.status_ipm != IPX_STATUS_not_run)
            return;
    }
    BuildStartingBasis();
    if (info_.status_ipm != IPX_STATUS_not_run || 
        info_.centring_tried)
        return;
    RunMainIPM(ipm);
}